

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O1

void __thiscall foxxll::ufs_file_base::_set_size(ufs_file_base *this,offset_type newsize)

{
  int iVar1;
  offset_type oVar2;
  __off64_t _Var3;
  ostream *poVar4;
  io_error *piVar5;
  int *piVar6;
  char *pcVar7;
  ostringstream msg;
  string local_1b0;
  ostringstream local_190 [376];
  
  oVar2 = _size(this);
  if (((this->mode_ & 1) == 0) && (this->is_device_ == false)) {
    iVar1 = ftruncate64(this->file_des_,newsize);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error in ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"void foxxll::ufs_file_base::_set_size(offset_type)",0x32);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"ftruncate() path=",0x11);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(this->filename_)._M_dataplus._M_p,
                          (this->filename_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," fd=",4);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->file_des_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      std::operator<<(poVar4,pcVar7);
      piVar5 = (io_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      io_error::io_error(piVar5,&local_1b0);
      __cxa_throw(piVar5,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  if (oVar2 < newsize) {
    _Var3 = lseek64(this->file_des_,newsize - 1,0);
    if (_Var3 < 0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error in ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"void foxxll::ufs_file_base::_set_size(offset_type)",0x32);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"lseek() path=",0xd);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(this->filename_)._M_dataplus._M_p,
                          (this->filename_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," fd=",4);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,this->file_des_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," pos=",5);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      piVar5 = (io_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      io_error::io_error(piVar5,&local_1b0);
      __cxa_throw(piVar5,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  return;
}

Assistant:

void ufs_file_base::_set_size(offset_type newsize)
{
    offset_type cur_size = _size();

    if (!(mode_ & RDONLY) && !is_device_)
    {
#if FOXXLL_WINDOWS || defined(__MINGW32__)
        HANDLE hfile = (HANDLE)::_get_osfhandle(file_des_);
        FOXXLL_THROW_ERRNO_NE_0(
            (hfile == INVALID_HANDLE_VALUE), io_error,
            "_get_osfhandle() path=" << filename_ << " fd=" << file_des_
        );

        LARGE_INTEGER desired_pos;
        desired_pos.QuadPart = newsize;

        if (!SetFilePointerEx(hfile, desired_pos, nullptr, FILE_BEGIN))
            FOXXLL_THROW_WIN_LASTERROR(
                io_error,
                "SetFilePointerEx in ufs_file_base::set_size(..) oldsize=" << cur_size <<
                    " newsize=" << newsize << " "
            );

        if (!SetEndOfFile(hfile))
            FOXXLL_THROW_WIN_LASTERROR(
                io_error,
                "SetEndOfFile oldsize=" << cur_size <<
                    " newsize=" << newsize << " "
            );
#else
        FOXXLL_THROW_ERRNO_NE_0(
            ::ftruncate(file_des_, newsize), io_error,
            "ftruncate() path=" << filename_ << " fd=" << file_des_
        );
#endif
    }

#if !FOXXLL_WINDOWS
    if (newsize > cur_size)
        FOXXLL_THROW_IF(
            ::lseek(file_des_, newsize - 1, SEEK_SET) < 0, io_error,
            "lseek() path=" << filename_ << " fd=" << file_des_ << " pos=" << newsize - 1
        );
#endif
}